

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

bool __thiscall Parser::match(Parser *this,string *token)

{
  int iVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  skip_whitespace(this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_40,&this->expr,this->pos,token->_M_string_length);
  if (local_40._M_string_length == token->_M_string_length) {
    if (local_40._M_string_length == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_40._M_dataplus._M_p,(token->_M_dataplus)._M_p,local_40._M_string_length);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    this->pos = this->pos + token->_M_string_length;
    skip_whitespace(this);
  }
  return bVar2;
}

Assistant:

bool match( const std::string & token )
  {
    skip_whitespace();
    if ( expr.substr( pos, token.length() ) == token )
    {
      pos += token.length();
      skip_whitespace();
      return true;
    }
    return false;
  }